

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-diy-fp.h
# Opt level: O2

void __thiscall icu_63::double_conversion::DiyFp::Normalize(DiyFp *this)

{
  int iVar1;
  ulong uVar2;
  
  iVar1 = this->e_;
  for (uVar2 = this->f_; uVar2 >> 0x36 == 0; uVar2 = uVar2 << 10) {
    iVar1 = iVar1 + -10;
  }
  for (; -1 < (long)uVar2; uVar2 = uVar2 * 2) {
    iVar1 = iVar1 + -1;
  }
  this->f_ = uVar2;
  this->e_ = iVar1;
  return;
}

Assistant:

void Normalize() {
    ASSERT(f_ != 0);
    uint64_t significand = f_;
    int exponent = e_;

    // This method is mainly called for normalizing boundaries. In general
    // boundaries need to be shifted by 10 bits. We thus optimize for this case.
    const uint64_t k10MSBits = UINT64_2PART_C(0xFFC00000, 00000000);
    while ((significand & k10MSBits) == 0) {
      significand <<= 10;
      exponent -= 10;
    }
    while ((significand & kUint64MSB) == 0) {
      significand <<= 1;
      exponent--;
    }
    f_ = significand;
    e_ = exponent;
  }